

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

CheckerInstanceStatementSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::CheckerInstanceStatementSyntax,slang::syntax::NamedLabelSyntax*&,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::syntax::CheckerInstantiationSyntax&>
          (BumpAllocator *this,NamedLabelSyntax **args,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_1,
          CheckerInstantiationSyntax *args_2)

{
  CheckerInstanceStatementSyntax *pCVar1;
  CheckerInstantiationSyntax *in_RDX;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_RSI;
  NamedLabelSyntax *in_RDI;
  CheckerInstanceStatementSyntax *unaff_retaddr;
  
  pCVar1 = (CheckerInstanceStatementSyntax *)
           allocate((BumpAllocator *)in_RDI,(size_t)in_RSI,(size_t)in_RDX);
  slang::syntax::CheckerInstanceStatementSyntax::CheckerInstanceStatementSyntax
            (unaff_retaddr,in_RDI,in_RSI,in_RDX);
  return pCVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }